

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODCode128Reader.cpp
# Opt level: O3

void __thiscall ZXing::OneD::Raw2TxtDecoder::Raw2TxtDecoder(Raw2TxtDecoder *this,int startCode)

{
  this->codeSet = 0xcc - startCode;
  (this->_symbologyIdentifier).code = 'C';
  (this->_symbologyIdentifier).modifier = '0';
  (this->_symbologyIdentifier).eciModifierOffset = '\0';
  (this->_symbologyIdentifier).aiFlag = None;
  this->_readerInit = false;
  (this->txt)._M_dataplus._M_p = (pointer)&(this->txt).field_2;
  (this->txt)._M_string_length = 0;
  (this->txt).field_2._M_local_buf[0] = '\0';
  this->lastTxtSize = 0;
  *(undefined4 *)((long)&this->lastTxtSize + 7) = 0;
  std::__cxx11::string::reserve((ulong)&this->txt);
  return;
}

Assistant:

Raw2TxtDecoder(int startCode) : codeSet(204 - startCode)
	{
		txt.reserve(20);
	}